

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O1

bool tinyusdz::anon_unknown_160::LoadAsset
               (AssetResolutionResolver *resolver,string *current_working_path,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *search_paths,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
               *fileformats,AssetPath *assetPath,Path *primPath,Layer *dst_layer,
               PrimSpec **dst_primspec_root,bool error_when_no_prims_found,
               bool error_when_asset_not_found,bool error_when_unsupported_fileformat,string *warn,
               string *err)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostringstream *poVar2;
  pointer pcVar3;
  void *pvVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  const_iterator cVar8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  Asset *asset_out;
  Layer *layer_00;
  string *psVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  long lVar13;
  char *pcVar14;
  _Alloc_hider _Var15;
  string *warn_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  PrimSpec *src_ps;
  string _err;
  string _warn;
  ostringstream ss_e_8;
  string resolved_path;
  Asset asset;
  string ext;
  string base_dir;
  ostringstream ss_e_6;
  Layer layer;
  string local_1e90;
  string local_1e70;
  long *local_1e50 [2];
  long local_1e40 [2];
  PrimSpec *local_1e30;
  undefined1 local_1e28 [32];
  undefined1 local_1e08 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1de8 [3];
  ios_base local_1d78 [264];
  undefined1 local_1c70 [32];
  Asset local_1c50;
  string local_1bd8;
  string local_1bb8;
  undefined1 local_1b98 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1b80;
  undefined1 auStack_1b70 [16];
  undefined1 auStack_1b60 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b48 [2];
  ios_base local_1b28 [1280];
  undefined1 local_1628 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1618;
  undefined1 local_1608 [16];
  storage_t<tinyusdz::Token> local_15f8;
  undefined1 auStack_15d8 [32];
  ios_base local_15b8 [544];
  undefined1 local_1398 [4848];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
  local_a8;
  undefined8 local_78;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  void *pvStack_38;
  
  if (dst_layer == (Layer *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1628,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"LoadAsset",9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"():",3);
    poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1628,0xac);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1628,"[Internal error]. `dst_layer` output arg is nullptr.",0x34);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"\n",1);
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,local_1b98._0_8_);
      if ((undefined1 *)local_1b98._0_8_ != local_1b98 + 0x10) {
        operator_delete((void *)local_1b98._0_8_,local_1b98._16_8_ + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
    ::std::ios_base::~ios_base(local_15b8);
    return false;
  }
  local_1e70._M_dataplus._M_p = (pointer)&local_1e70.field_2;
  pcVar3 = (assetPath->asset_path_)._M_dataplus._M_p;
  pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fileformats;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e70,pcVar3,pcVar3 + (assetPath->asset_path_)._M_string_length);
  GetExtension(&local_1bd8,&local_1e70);
  if (local_1e70._M_string_length == 0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1628,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"LoadAsset",9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"():",3);
    poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1628,0xb4);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1628,
               "TODO: No assetPath but Prim path(e.g. </xform>) in references.",0x3e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"\n",1);
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,local_1b98._0_8_);
      if ((undefined1 *)local_1b98._0_8_ != local_1b98 + 0x10) {
        operator_delete((void *)local_1b98._0_8_,local_1b98._16_8_ + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
    ::std::ios_base::~ios_base(local_15b8);
    bVar5 = false;
    goto LAB_001b7ffc;
  }
  if (current_working_path->_M_string_length != 0) {
    ::std::__cxx11::string::_M_assign((string *)&resolver->_current_working_path);
  }
  if ((search_paths->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (search_paths->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&resolver->_search_paths,search_paths);
  }
  AssetResolutionResolver::resolve((string *)local_1c70,resolver,&local_1e70);
  if (local_1c70._8_8_ == 0) {
    if (error_when_asset_not_found) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1628,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"LoadAsset",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"():",3);
      poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1628,0xca);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      local_1de8[0]._M_dataplus._M_p = (pointer)&local_1de8[0].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_1e08 + 0x20),"Failed to resolve asset path `{}`","");
      fmt::format<std::__cxx11::string>
                ((string *)local_1b98,(fmt *)(local_1e08 + 0x20),(string *)&local_1e70,pbVar12);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1628,(char *)local_1b98._0_8_,local_1b98._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      if ((undefined1 *)local_1b98._0_8_ != local_1b98 + 0x10) {
        operator_delete((void *)local_1b98._0_8_,local_1b98._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1de8[0]._M_dataplus._M_p != &local_1de8[0].field_2) {
        operator_delete(local_1de8[0]._M_dataplus._M_p,
                        CONCAT71(local_1de8[0].field_2._M_allocated_capacity._1_7_,
                                 local_1de8[0].field_2._M_local_buf[0]) + 1);
      }
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)err,local_1b98._0_8_);
        if ((undefined1 *)local_1b98._0_8_ != local_1b98 + 0x10) {
          operator_delete((void *)local_1b98._0_8_,local_1b98._16_8_ + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
      ::std::ios_base::~ios_base(local_15b8);
      bVar5 = false;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"[warn]",6);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1628,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"LoadAsset",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"():",3);
      poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1628,0xcc);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      local_1de8[0]._M_dataplus._M_p = (pointer)&local_1de8[0].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_1e08 + 0x20),"Asset not found: `{}`","");
      fmt::format<std::__cxx11::string>
                ((string *)local_1b98,(fmt *)(local_1e08 + 0x20),(string *)&local_1e70,pbVar12);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1628,(char *)local_1b98._0_8_,local_1b98._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      if ((undefined1 *)local_1b98._0_8_ != local_1b98 + 0x10) {
        operator_delete((void *)local_1b98._0_8_,local_1b98._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1de8[0]._M_dataplus._M_p != &local_1de8[0].field_2) {
        operator_delete(local_1de8[0]._M_dataplus._M_p,
                        CONCAT71(local_1de8[0].field_2._M_allocated_capacity._1_7_,
                                 local_1de8[0].field_2._M_local_buf[0]) + 1);
      }
      if (warn != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)warn,local_1b98._0_8_);
        if ((undefined1 *)local_1b98._0_8_ != local_1b98 + 0x10) {
          operator_delete((void *)local_1b98._0_8_,local_1b98._16_8_ + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
      ::std::ios_base::~ios_base(local_15b8);
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"[warn]",6);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1628,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"LoadAsset",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"():",3);
      poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1628,0xdc);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      local_1de8[0]._M_dataplus._M_p = (pointer)&local_1de8[0].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_1e08 + 0x20),"  current working path: `{}`","");
      fmt::format<std::__cxx11::string>
                ((string *)local_1b98,(fmt *)(local_1e08 + 0x20),(string *)current_working_path,
                 pbVar12);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1628,(char *)local_1b98._0_8_,local_1b98._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      if ((undefined1 *)local_1b98._0_8_ != local_1b98 + 0x10) {
        operator_delete((void *)local_1b98._0_8_,local_1b98._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1de8[0]._M_dataplus._M_p != &local_1de8[0].field_2) {
        operator_delete(local_1de8[0]._M_dataplus._M_p,
                        CONCAT71(local_1de8[0].field_2._M_allocated_capacity._1_7_,
                                 local_1de8[0].field_2._M_local_buf[0]) + 1);
      }
      if (warn != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)warn,local_1b98._0_8_);
        if ((undefined1 *)local_1b98._0_8_ != local_1b98 + 0x10) {
          operator_delete((void *)local_1b98._0_8_,local_1b98._16_8_ + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
      ::std::ios_base::~ios_base(local_15b8);
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"[warn]",6);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1628,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"LoadAsset",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"():",3);
      poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1628,0xde);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      local_1de8[0]._M_dataplus._M_p = (pointer)&local_1de8[0].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_1e08 + 0x20),"  resolver.current_working_path: `{}`","");
      fmt::format<std::__cxx11::string>
                ((string *)local_1b98,(fmt *)(local_1e08 + 0x20),
                 (string *)&resolver->_current_working_path,pbVar12);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1628,(char *)local_1b98._0_8_,local_1b98._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      if ((undefined1 *)local_1b98._0_8_ != local_1b98 + 0x10) {
        operator_delete((void *)local_1b98._0_8_,local_1b98._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1de8[0]._M_dataplus._M_p != &local_1de8[0].field_2) {
        operator_delete(local_1de8[0]._M_dataplus._M_p,
                        CONCAT71(local_1de8[0].field_2._M_allocated_capacity._1_7_,
                                 local_1de8[0].field_2._M_local_buf[0]) + 1);
      }
      if (warn != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)warn,local_1b98._0_8_);
        if ((undefined1 *)local_1b98._0_8_ != local_1b98 + 0x10) {
          operator_delete((void *)local_1b98._0_8_,local_1b98._16_8_ + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
      ::std::ios_base::~ios_base(local_15b8);
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"[warn]",6);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1628,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"LoadAsset",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"():",3);
      poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1628,0xdf);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      local_1de8[0]._M_dataplus._M_p = (pointer)&local_1de8[0].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_1e08 + 0x20),"  search_paths: `{}`","");
      fmt::format<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)local_1b98,(fmt *)(local_1e08 + 0x20),(string *)search_paths,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)pbVar12);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1628,(char *)local_1b98._0_8_,local_1b98._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      if ((undefined1 *)local_1b98._0_8_ != local_1b98 + 0x10) {
        operator_delete((void *)local_1b98._0_8_,local_1b98._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1de8[0]._M_dataplus._M_p != &local_1de8[0].field_2) {
        operator_delete(local_1de8[0]._M_dataplus._M_p,
                        CONCAT71(local_1de8[0].field_2._M_allocated_capacity._1_7_,
                                 local_1de8[0].field_2._M_local_buf[0]) + 1);
      }
      if (warn != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)warn,local_1b98._0_8_);
        if ((undefined1 *)local_1b98._0_8_ != local_1b98 + 0x10) {
          operator_delete((void *)local_1b98._0_8_,local_1b98._16_8_ + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
      ::std::ios_base::~ios_base(local_15b8);
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"[warn]",6);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1628,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"LoadAsset",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"():",3);
      poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1628,0xe1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      local_1de8[0]._M_dataplus._M_p = (pointer)&local_1de8[0].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_1e08 + 0x20),"  resolver.search_paths: `{}`","");
      fmt::format<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)local_1b98,(fmt *)(local_1e08 + 0x20),(string *)&resolver->_search_paths,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)pbVar12);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1628,(char *)local_1b98._0_8_,local_1b98._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      if ((undefined1 *)local_1b98._0_8_ != local_1b98 + 0x10) {
        operator_delete((void *)local_1b98._0_8_,local_1b98._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1de8[0]._M_dataplus._M_p != &local_1de8[0].field_2) {
        operator_delete(local_1de8[0]._M_dataplus._M_p,
                        CONCAT71(local_1de8[0].field_2._M_allocated_capacity._1_7_,
                                 local_1de8[0].field_2._M_local_buf[0]) + 1);
      }
      if (warn != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)warn,local_1b98._0_8_);
        if ((undefined1 *)local_1b98._0_8_ != local_1b98 + 0x10) {
          operator_delete((void *)local_1b98._0_8_,local_1b98._16_8_ + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
      ::std::ios_base::~ios_base(local_15b8);
      *dst_primspec_root = (PrimSpec *)0x0;
      bVar5 = true;
    }
  }
  else {
    this = &resolver->_search_paths;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(this,search_paths);
    io::GetBaseDir(&local_1bb8,(string *)local_1c70);
    if ((optional<tinyusdz::Axis>)local_1bb8._M_string_length != (optional<tinyusdz::Axis>)0x0) {
      ::std::__cxx11::string::_M_assign((string *)&resolver->_current_working_path);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this,&local_1bb8);
    }
    local_1c50.version_._M_dataplus._M_p = (pointer)&local_1c50.version_.field_2;
    local_1c50.version_._M_string_length = 0;
    local_1c50.version_.field_2._M_local_buf[0] = '\0';
    local_1c50.name_._M_dataplus._M_p = (pointer)&local_1c50.name_.field_2;
    local_1c50.name_._M_string_length = 0;
    local_1c50.name_.field_2._M_local_buf[0] = '\0';
    local_1c50.resolved_name_._M_dataplus._M_p = (pointer)&local_1c50.resolved_name_.field_2;
    local_1c50.resolved_name_._M_string_length = 0;
    local_1c50.resolved_name_.field_2._M_local_buf[0] = '\0';
    local_1c50.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c50.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c50.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    asset_out = &local_1c50;
    psVar11 = (string *)err;
    bVar5 = AssetResolutionResolver::open_asset
                      (resolver,(string *)local_1c70,&local_1e70,asset_out,warn,err);
    if (bVar5) {
      bVar5 = IsUSDFileFormat(&local_1e70);
      if ((bVar5) || (bVar5 = IsMtlxFileFormat(&local_1e70), bVar5)) {
        bVar5 = IsUSDFileFormat(&local_1e70);
        if ((bVar5) || (bVar5 = IsMtlxFileFormat(&local_1e70), bVar5)) goto LAB_001b7069;
        if (error_when_unsupported_fileformat) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1628,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"LoadAsset",9);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"():",3);
          poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1628,0x104);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          pcVar14 = "TODO: Unknown/unsupported asset file format: {}";
          goto LAB_001b7714;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"[warn]",6);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1628,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"LoadAsset",9);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"():",3);
        poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1628,0x108);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        pcVar14 = "TODO: Unknown/unsupported asset file format. Skipped: {}";
      }
      else {
        cVar8 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                ::find(&fileformats->_M_t,&local_1bd8);
        asset_out = (Asset *)&(fileformats->_M_t)._M_impl.super__Rb_tree_header;
        if ((Asset *)cVar8._M_node != asset_out) {
LAB_001b7069:
          local_1628._0_8_ = &local_1618;
          local_1628._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_1618._M_local_buf[0] = '\0';
          local_1608._0_8_ = auStack_15d8;
          local_1608._8_8_ = (anon_struct_8_0_00000001_for___align)0x1;
          local_15f8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_15f8._8_8_ = 0;
          local_15f8._16_4_ = 1.0;
          local_15f8._24_8_ = 0;
          auStack_15d8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          LayerMetas::LayerMetas((LayerMetas *)(auStack_15d8 + 8));
          local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_a8._M_impl.super__Rb_tree_header._M_header;
          local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_70._M_p = (pointer)&local_60;
          local_78._0_1_ = true;
          local_78._1_1_ = true;
          local_78._2_1_ = true;
          local_78._3_1_ = true;
          local_78._4_1_ = true;
          local_78._5_1_ = true;
          local_78._6_1_ = true;
          local_78._7_1_ = true;
          local_68 = 0;
          local_60._M_local_buf[0] = '\0';
          local_50.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_50.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_50.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pvStack_38 = (void *)0x0;
          local_1e08._0_8_ = local_1e08 + 0x10;
          local_1e08._8_8_ = 0;
          local_1e08[0x10] = '\0';
          local_1e28._0_8_ = local_1e28 + 0x10;
          local_1e28._8_8_ = 0;
          local_1e28[0x10] = '\0';
          local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
               local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
          bVar5 = IsUSDFileFormat(&local_1e70);
          if (bVar5) {
            auStack_1b60._8_8_ = (long)auStack_1b70 + 8;
            auStack_1b70[0] = false;
            auStack_1b70._1_3_ = 0;
            auStack_1b70._4_4_ = (storage_t<unsigned_int>)0x0;
            local_1b98._0_8_ = (char *)0x4000ffffffff;
            local_1b98[8] = true;
            local_1b98._9_3_ = 0;
            local_1b98._12_4_ = (storage_t<tinyusdz::Axis>)0x0;
            local_1b98._16_8_ = 0x80000000400;
            aStack_1b80._M_allocated_capacity = 0x400000800;
            aStack_1b80._M_local_buf[8] = false;
            aStack_1b80._M_local_buf[9] = false;
            aStack_1b80._M_local_buf[10] = false;
            aStack_1b80._11_5_ = 0;
            auStack_1b70._8_8_ = 0;
            auStack_1b60._0_8_ = (_Link_type)0x0;
            local_1b48[0]._M_allocated_capacity = (pointer)0x0;
            local_1b48[0]._8_8_ = (pointer)0x1;
            layer_00 = (Layer *)local_1628;
            warn_00 = (string *)local_1e08;
            psVar11 = (string *)local_1e28;
            auStack_1b60._16_8_ = auStack_1b60._8_8_;
            bVar5 = LoadLayerFromMemory(local_1c50.buf_.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_1c50.buf_.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_1c50.buf_.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                        (string *)&local_1e70,layer_00,warn_00,psVar11,
                                        (USDLoadOptions *)local_1b98);
            ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
            ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                        *)auStack_1b70,(_Link_type)auStack_1b60._0_8_);
            if (!bVar5) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b98);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b98,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b98,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                         ,0x55);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b98,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b98,"LoadAsset",9);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b98,"():",3);
              poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b98,0x125);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              local_1e90._M_dataplus._M_p = (pointer)&local_1e90.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1e90,"Failed to open `{}` as Layer: {}","");
              fmt::format<std::__cxx11::string,std::__cxx11::string>
                        ((string *)(local_1e08 + 0x20),(fmt *)&local_1e90,&local_1e70,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1e28,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         warn_00);
              poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1b98,local_1de8[0]._M_dataplus._M_p,
                                  local_1de8[0]._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1de8[0]._M_dataplus._M_p != &local_1de8[0].field_2) {
                operator_delete(local_1de8[0]._M_dataplus._M_p,
                                CONCAT71(local_1de8[0].field_2._M_allocated_capacity._1_7_,
                                         local_1de8[0].field_2._M_local_buf[0]) + 1);
              }
              _Var15._M_p = local_1e90._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e90._M_dataplus._M_p != &local_1e90.field_2) {
LAB_001b74d1:
                operator_delete(_Var15._M_p,local_1e90.field_2._M_allocated_capacity + 1);
              }
              goto joined_r0x001b74ec;
            }
LAB_001b71fa:
            pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT71((int7)((ulong)layer_00 >> 8),
                               warn == (string *)0x0 || local_1e08._8_8_ == 0);
            if (warn != (string *)0x0 && local_1e08._8_8_ != 0) {
              ::std::__cxx11::string::_M_append((char *)warn,local_1e08._0_8_);
            }
            if (local_15f8._8_8_ == 0) {
              if (error_when_no_prims_found) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b98);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b98,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b98,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                           ,0x55);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b98,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b98,"LoadAsset",9);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b98,"():",3);
                poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b98,0x15a);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                local_1e90._M_dataplus._M_p = (pointer)&local_1e90.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1e90,"No prims in layer `{}`","");
                fmt::format<std::__cxx11::string>
                          ((string *)(local_1e08 + 0x20),(fmt *)&local_1e90,(string *)&local_1e70,
                           pbVar12);
                poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1b98,local_1de8[0]._M_dataplus._M_p,
                                    local_1de8[0]._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1de8[0]._M_dataplus._M_p != &local_1de8[0].field_2) {
                  operator_delete(local_1de8[0]._M_dataplus._M_p,
                                  CONCAT71(local_1de8[0].field_2._M_allocated_capacity._1_7_,
                                           local_1de8[0].field_2._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e90._M_dataplus._M_p != &local_1e90.field_2) goto LAB_001b7a7c;
                goto joined_r0x001b74ec;
              }
              if (dst_primspec_root != (PrimSpec **)0x0) {
                *dst_primspec_root = (PrimSpec *)0x0;
              }
            }
            else {
              local_1e30 = (PrimSpec *)0x0;
              if (dst_primspec_root != (PrimSpec **)0x0) {
                local_1de8[0]._M_dataplus._M_p = (pointer)&local_1de8[0].field_2;
                local_1de8[0]._M_string_length = 0;
                local_1de8[0].field_2._M_local_buf[0] = '\0';
                if (primPath->_valid == true) {
                  ::std::__cxx11::string::_M_assign((string *)(local_1e08 + 0x20));
                }
                else {
                  if ((anon_struct_8_0_00000001_for___align)local_1398._8_8_ ==
                      (anon_struct_8_0_00000001_for___align)0x0) {
                    pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)local_15f8.data._0_8_ + 8);
                  }
                  else {
                    pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1398;
                  }
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_1b98,"/",pbVar12);
                  ::std::__cxx11::string::operator=
                            ((string *)(local_1e08 + 0x20),(string *)local_1b98);
                  if ((undefined1 *)local_1b98._0_8_ != local_1b98 + 0x10) {
                    operator_delete((void *)local_1b98._0_8_,local_1b98._16_8_ + 1);
                  }
                }
                paVar1 = &local_1e90.field_2;
                local_1e90._M_dataplus._M_p = (pointer)paVar1;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e90,"");
                Path::Path((Path *)local_1b98,(string *)(local_1e08 + 0x20),&local_1e90);
                bVar5 = Layer::find_primspec_at
                                  ((Layer *)local_1628,(Path *)local_1b98,&local_1e30,err);
                Path::~Path((Path *)local_1b98);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e90._M_dataplus._M_p != paVar1) {
                  operator_delete(local_1e90._M_dataplus._M_p,
                                  local_1e90.field_2._M_allocated_capacity + 1);
                }
                if (bVar5) {
                  if (local_1e30 == (PrimSpec *)0x0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b98);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b98,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b98,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                               ,0x55);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b98,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b98,"LoadAsset",9);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b98,"():",3);
                    poVar7 = (ostream *)
                             ::std::ostream::operator<<((ostringstream *)local_1b98,0x180);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                    pcVar14 = "Internal error: PrimSpec pointer is nullptr.";
                    lVar13 = 0x2c;
                  }
                  else {
                    bVar5 = PropagateAssetResolverState
                                      (0,local_1e30,&resolver->_current_working_path,this);
                    if (bVar5) {
                      *dst_primspec_root = local_1e30;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1de8[0]._M_dataplus._M_p != &local_1de8[0].field_2) {
                        operator_delete(local_1de8[0]._M_dataplus._M_p,
                                        CONCAT71(local_1de8[0].field_2._M_allocated_capacity._1_7_,
                                                 local_1de8[0].field_2._M_local_buf[0]) + 1);
                      }
                      goto LAB_001b8494;
                    }
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b98);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b98,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b98,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                               ,0x55);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b98,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b98,"LoadAsset",9);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b98,"():",3);
                    poVar7 = (ostream *)
                             ::std::ostream::operator<<((ostringstream *)local_1b98,0x187);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                    pcVar14 = "Store AssetResolver state to each PrimSpec failed.\n";
                    lVar13 = 0x33;
                  }
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b98,pcVar14,lVar13);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b98,"\n",1)
                  ;
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b98);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b98,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b98,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                             ,0x55);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b98,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b98,"LoadAsset",9);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b98,"():",3);
                  poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b98,0x17c);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                  local_1e50[0] = local_1e40;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1e50,
                             "Failed to find PrimSpec `{}` in layer `{}`(resolved path: `{}`)","");
                  fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                            (&local_1e90,(fmt *)local_1e50,(string *)(local_1e08 + 0x20),&local_1e70
                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1c70,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar11);
                  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_1b98,local_1e90._M_dataplus._M_p,
                                      local_1e90._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1e90._M_dataplus._M_p != paVar1) {
                    operator_delete(local_1e90._M_dataplus._M_p,
                                    local_1e90.field_2._M_allocated_capacity + 1);
                  }
                  if (local_1e50[0] != local_1e40) {
                    operator_delete(local_1e50[0],local_1e40[0] + 1);
                  }
                }
                if (err != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::__cxx11::string::_M_append((char *)err,(ulong)local_1e90._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1e90._M_dataplus._M_p != paVar1) {
                    operator_delete(local_1e90._M_dataplus._M_p,
                                    local_1e90.field_2._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b98);
                ::std::ios_base::~ios_base(local_1b28);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1de8[0]._M_dataplus._M_p != &local_1de8[0].field_2) {
                  operator_delete(local_1de8[0]._M_dataplus._M_p,
                                  CONCAT71(local_1de8[0].field_2._M_allocated_capacity._1_7_,
                                           local_1de8[0].field_2._M_local_buf[0]) + 1);
                }
                goto LAB_001b7af6;
              }
LAB_001b8494:
              pvVar4 = resolver->_userdata;
              ::std::__cxx11::string::_M_assign((string *)&local_70);
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator=(&local_50,this);
              pvStack_38 = pvVar4;
            }
            Layer::operator=(dst_layer,(Layer *)local_1628);
            bVar5 = true;
          }
          else {
            bVar5 = IsMtlxFileFormat(&local_1e70);
            if (bVar5) {
              iVar6 = ::std::__cxx11::string::compare((char *)primPath);
              if (iVar6 == 0) {
                PrimSpec::PrimSpec((PrimSpec *)local_1b98);
                layer_00 = (Layer *)local_1e08;
                bVar5 = LoadMaterialXFromAsset
                                  (&local_1c50,&local_1e70,(PrimSpec *)local_1b98,(string *)layer_00
                                   ,(string *)local_1e28);
                if (bVar5) {
                  ::std::__cxx11::string::operator=((string *)auStack_1b70,"MaterialX");
                  local_1de8[0]._M_dataplus._M_p = (pointer)&local_1de8[0].field_2;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)(local_1e08 + 0x20),"MaterialX","");
                  pmVar10 = ::std::__detail::
                            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                          *)local_1608,(key_type *)(local_1e08 + 0x20));
                  if (pmVar10 != (PrimSpec *)local_1b98) {
                    PrimSpec::CopyFrom(pmVar10,(PrimSpec *)local_1b98);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1de8[0]._M_dataplus._M_p != &local_1de8[0].field_2) {
                    operator_delete(local_1de8[0]._M_dataplus._M_p,
                                    CONCAT71(local_1de8[0].field_2._M_allocated_capacity._1_7_,
                                             local_1de8[0].field_2._M_local_buf[0]) + 1);
                  }
                }
                else {
                  poVar2 = (ostringstream *)(local_1e08 + 0x20);
                  ::std::__cxx11::ostringstream::ostringstream(poVar2);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar2,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                             ,0x55);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar2,"LoadAsset",9);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"():",3);
                  poVar7 = (ostream *)::std::ostream::operator<<(poVar2,0x131);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                  local_1e50[0] = local_1e40;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1e50,"Failed to open mtlx asset `{}`","");
                  fmt::format<std::__cxx11::string>
                            ((string *)&local_1e90,(fmt *)local_1e50,(string *)&local_1e70,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             layer_00);
                  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)poVar2,local_1e90._M_dataplus._M_p,
                                      local_1e90._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1e90._M_dataplus._M_p != &local_1e90.field_2) {
                    operator_delete(local_1e90._M_dataplus._M_p,
                                    local_1e90.field_2._M_allocated_capacity + 1);
                  }
                  if (local_1e50[0] != local_1e40) {
                    operator_delete(local_1e50[0],local_1e40[0] + 1);
                  }
                  if (err != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::__cxx11::string::_M_append
                              ((char *)err,(ulong)local_1e90._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1e90._M_dataplus._M_p != &local_1e90.field_2) {
                      operator_delete(local_1e90._M_dataplus._M_p,
                                      local_1e90.field_2._M_allocated_capacity + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream
                            ((ostringstream *)(local_1e08 + 0x20));
                  ::std::ios_base::~ios_base(local_1d78);
                }
                PrimSpec::~PrimSpec((PrimSpec *)local_1b98);
                if (bVar5) goto LAB_001b71fa;
                bVar5 = false;
                goto LAB_001b7af8;
              }
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b98);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b98,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b98,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                         ,0x55);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b98,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b98,"LoadAsset",9);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b98,"():",3);
              poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b98,299);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_1e08 + 0x20),"Prim path must be </MaterialX>, but got: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               primPath);
              poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1b98,local_1de8[0]._M_dataplus._M_p,
                                  local_1de8[0]._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1de8[0]._M_dataplus._M_p != &local_1de8[0].field_2) {
                local_1e90.field_2._M_allocated_capacity =
                     CONCAT71(local_1de8[0].field_2._M_allocated_capacity._1_7_,
                              local_1de8[0].field_2._M_local_buf[0]);
                _Var15._M_p = local_1de8[0]._M_dataplus._M_p;
                goto LAB_001b74d1;
              }
joined_r0x001b74ec:
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::_M_append((char *)err,(ulong)local_1de8[0]._M_dataplus._M_p)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1de8[0]._M_dataplus._M_p != &local_1de8[0].field_2) {
                  operator_delete(local_1de8[0]._M_dataplus._M_p,
                                  CONCAT71(local_1de8[0].field_2._M_allocated_capacity._1_7_,
                                           local_1de8[0].field_2._M_local_buf[0]) + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b98);
              ::std::ios_base::~ios_base(local_1b28);
            }
            else {
              cVar8 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                      ::find(&fileformats->_M_t,&local_1bd8);
              pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &(fileformats->_M_t)._M_impl.super__Rb_tree_header;
              if (cVar8._M_node == (_Base_ptr)pbVar12) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b98);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b98,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b98,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                           ,0x55);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b98,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b98,"LoadAsset",9);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b98,"():",3);
                poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b98,0x14a);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                local_1e90._M_dataplus._M_p = (pointer)&local_1e90.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1e90,"FileFormat handler not found for asset `{}`","");
                fmt::format<std::__cxx11::string>
                          ((string *)(local_1e08 + 0x20),(fmt *)&local_1e90,(string *)&local_1e70,
                           pbVar12);
                poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1b98,local_1de8[0]._M_dataplus._M_p,
                                    local_1de8[0]._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1de8[0]._M_dataplus._M_p != &local_1de8[0].field_2) {
                  operator_delete(local_1de8[0]._M_dataplus._M_p,
                                  CONCAT71(local_1de8[0].field_2._M_allocated_capacity._1_7_,
                                           local_1de8[0].field_2._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e90._M_dataplus._M_p != &local_1e90.field_2) {
LAB_001b7a7c:
                  operator_delete(local_1e90._M_dataplus._M_p,
                                  local_1e90.field_2._M_allocated_capacity + 1);
                }
                goto joined_r0x001b74ec;
              }
              PrimSpec::PrimSpec((PrimSpec *)local_1b98);
              pmVar9 = ::std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                       ::at(fileformats,&local_1bd8);
              args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       pmVar9->userdata;
              layer_00 = (Layer *)local_1e28;
              bVar5 = (*pmVar9->reader)(&local_1c50,(PrimSpec *)local_1b98,(string *)local_1e08,
                                        (string *)layer_00,args_1);
              if (bVar5) {
                if (auStack_1b70._8_8_ != 0) {
                  pmVar10 = ::std::__detail::
                            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                          *)local_1608,(key_type *)auStack_1b70);
                  if (pmVar10 != (PrimSpec *)local_1b98) {
                    PrimSpec::CopyFrom(pmVar10,(PrimSpec *)local_1b98);
                  }
                  PrimSpec::~PrimSpec((PrimSpec *)local_1b98);
                  goto LAB_001b71fa;
                }
                poVar2 = (ostringstream *)(local_1e08 + 0x20);
                ::std::__cxx11::ostringstream::ostringstream(poVar2);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                           ,0x55);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar2,"LoadAsset",9);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"():",3);
                poVar7 = (ostream *)::std::ostream::operator<<(poVar2,0x143);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                local_1e50[0] = local_1e40;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1e50,"PrimSpec element_name is empty. asset `{}`","");
                fmt::format<std::__cxx11::string>
                          ((string *)&local_1e90,(fmt *)local_1e50,(string *)&local_1e70,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           layer_00);
                poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)poVar2,local_1e90._M_dataplus._M_p,
                                    local_1e90._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e90._M_dataplus._M_p != &local_1e90.field_2) {
                  operator_delete(local_1e90._M_dataplus._M_p,
                                  local_1e90.field_2._M_allocated_capacity + 1);
                }
                if (local_1e50[0] != local_1e40) goto LAB_001b7cf8;
              }
              else {
                poVar2 = (ostringstream *)(local_1e08 + 0x20);
                ::std::__cxx11::ostringstream::ostringstream(poVar2);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                           ,0x55);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar2,"LoadAsset",9);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"():",3);
                poVar7 = (ostream *)::std::ostream::operator<<(poVar2,0x13e);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                local_1e50[0] = local_1e40;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1e50,"Failed to read asset `{}` error: {}","");
                fmt::format<std::__cxx11::string,std::__cxx11::string>
                          (&local_1e90,(fmt *)local_1e50,&local_1e70,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1e28,args_1);
                poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)poVar2,local_1e90._M_dataplus._M_p,
                                    local_1e90._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e90._M_dataplus._M_p != &local_1e90.field_2) {
                  operator_delete(local_1e90._M_dataplus._M_p,
                                  local_1e90.field_2._M_allocated_capacity + 1);
                }
                if (local_1e50[0] != local_1e40) {
LAB_001b7cf8:
                  operator_delete(local_1e50[0],local_1e40[0] + 1);
                }
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::_M_append((char *)err,(ulong)local_1e90._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e90._M_dataplus._M_p != &local_1e90.field_2) {
                  operator_delete(local_1e90._M_dataplus._M_p,
                                  local_1e90.field_2._M_allocated_capacity + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1e08 + 0x20));
              ::std::ios_base::~ios_base(local_1d78);
              PrimSpec::~PrimSpec((PrimSpec *)local_1b98);
            }
LAB_001b7af6:
            bVar5 = false;
          }
LAB_001b7af8:
          if ((undefined1 *)local_1e28._0_8_ != local_1e28 + 0x10) {
            operator_delete((void *)local_1e28._0_8_,
                            CONCAT71(local_1e28._17_7_,local_1e28[0x10]) + 1);
          }
          if ((undefined1 *)local_1e08._0_8_ != local_1e08 + 0x10) {
            operator_delete((void *)local_1e08._0_8_,
                            CONCAT71(local_1e08._17_7_,local_1e08[0x10]) + 1);
          }
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_p != &local_60) {
            operator_delete(local_70._M_p,
                            CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0])
                            + 1);
          }
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
          ::_M_erase(&local_a8,
                     (_Link_type)local_a8._M_impl.super__Rb_tree_header._M_header._M_parent);
          LayerMetas::~LayerMetas((LayerMetas *)(auStack_15d8 + 8));
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_1608);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1628._0_8_ != &local_1618) {
            operator_delete((void *)local_1628._0_8_,
                            CONCAT71(local_1618._M_allocated_capacity._1_7_,
                                     local_1618._M_local_buf[0]) + 1);
          }
          goto LAB_001b7f36;
        }
        if (error_when_unsupported_fileformat) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1628,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"LoadAsset",9);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"():",3);
          poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1628,0x114);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          pcVar14 = "Unknown/unsupported asset file format: {}";
LAB_001b7714:
          local_1de8[0]._M_dataplus._M_p = (pointer)&local_1de8[0].field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_1e08 + 0x20),pcVar14,"");
          psVar11 = (string *)&local_1e70;
          goto LAB_001b66f7;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"[warn]",6);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1628,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"LoadAsset",9);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"():",3);
        poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1628,0x117);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        pcVar14 = "Unknown/unsupported asset file format. Skipped: {}";
      }
      local_1de8[0]._M_dataplus._M_p = (pointer)&local_1de8[0].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)(local_1e08 + 0x20),pcVar14,"");
      fmt::format<std::__cxx11::string>
                ((string *)local_1b98,(fmt *)(local_1e08 + 0x20),(string *)&local_1e70,
                 &asset_out->version_);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1628,(char *)local_1b98._0_8_,local_1b98._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      if ((undefined1 *)local_1b98._0_8_ != local_1b98 + 0x10) {
        operator_delete((void *)local_1b98._0_8_,local_1b98._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1de8[0]._M_dataplus._M_p != &local_1de8[0].field_2) {
        operator_delete(local_1de8[0]._M_dataplus._M_p,
                        CONCAT71(local_1de8[0].field_2._M_allocated_capacity._1_7_,
                                 local_1de8[0].field_2._M_local_buf[0]) + 1);
      }
      if (warn != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)warn,local_1b98._0_8_);
        if ((undefined1 *)local_1b98._0_8_ != local_1b98 + 0x10) {
          operator_delete((void *)local_1b98._0_8_,local_1b98._16_8_ + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
      ::std::ios_base::~ios_base(local_15b8);
      bVar5 = true;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1628,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"LoadAsset",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1628,"():",3);
      poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1628,0xf7);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      local_1de8[0]._M_dataplus._M_p = (pointer)&local_1de8[0].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_1e08 + 0x20),"Failed to open asset `{}`.","");
      psVar11 = (string *)local_1c70;
LAB_001b66f7:
      fmt::format<std::__cxx11::string>
                ((string *)local_1b98,(fmt *)(local_1e08 + 0x20),psVar11,&asset_out->version_);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1628,(char *)local_1b98._0_8_,local_1b98._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      if ((undefined1 *)local_1b98._0_8_ != local_1b98 + 0x10) {
        operator_delete((void *)local_1b98._0_8_,local_1b98._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1de8[0]._M_dataplus._M_p != &local_1de8[0].field_2) {
        operator_delete(local_1de8[0]._M_dataplus._M_p,
                        CONCAT71(local_1de8[0].field_2._M_allocated_capacity._1_7_,
                                 local_1de8[0].field_2._M_local_buf[0]) + 1);
      }
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)err,local_1b98._0_8_);
        if ((undefined1 *)local_1b98._0_8_ != local_1b98 + 0x10) {
          operator_delete((void *)local_1b98._0_8_,local_1b98._16_8_ + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
      ::std::ios_base::~ios_base(local_15b8);
      bVar5 = false;
    }
LAB_001b7f36:
    if ((_Base_ptr)
        local_1c50.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
      operator_delete(local_1c50.buf_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1c50.buf_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c50.buf_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c50.resolved_name_._M_dataplus._M_p != &local_1c50.resolved_name_.field_2) {
      operator_delete(local_1c50.resolved_name_._M_dataplus._M_p,
                      CONCAT71(local_1c50.resolved_name_.field_2._M_allocated_capacity._1_7_,
                               local_1c50.resolved_name_.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c50.name_._M_dataplus._M_p != &local_1c50.name_.field_2) {
      operator_delete(local_1c50.name_._M_dataplus._M_p,
                      CONCAT71(local_1c50.name_.field_2._M_allocated_capacity._1_7_,
                               local_1c50.name_.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c50.version_._M_dataplus._M_p != &local_1c50.version_.field_2) {
      operator_delete(local_1c50.version_._M_dataplus._M_p,
                      CONCAT71(local_1c50.version_.field_2._M_allocated_capacity._1_7_,
                               local_1c50.version_.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1bb8._M_dataplus._M_p != &local_1bb8.field_2) {
      operator_delete(local_1bb8._M_dataplus._M_p,local_1bb8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((undefined1 *)local_1c70._0_8_ != local_1c70 + 0x10) {
    operator_delete((void *)local_1c70._0_8_,local_1c70._16_8_ + 1);
  }
LAB_001b7ffc:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1bd8._M_dataplus._M_p != &local_1bd8.field_2) {
    operator_delete(local_1bd8._M_dataplus._M_p,local_1bd8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e70._M_dataplus._M_p != &local_1e70.field_2) {
    operator_delete(local_1e70._M_dataplus._M_p,local_1e70.field_2._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

bool LoadAsset(AssetResolutionResolver &resolver,
               const std::string &current_working_path,
               const std::vector<std::string> &search_paths,
               const std::map<std::string, FileFormatHandler> &fileformats,
               const value::AssetPath &assetPath, const Path &primPath,
               Layer *dst_layer, const PrimSpec **dst_primspec_root,
               const bool error_when_no_prims_found,
               const bool error_when_asset_not_found,
               const bool error_when_unsupported_fileformat, std::string *warn,
               std::string *err) {
  if (!dst_layer) {
    PUSH_ERROR_AND_RETURN(
        "[Internal error]. `dst_layer` output arg is nullptr.");
  }

  std::string asset_path = assetPath.GetAssetPath();
  std::string ext = GetExtension(asset_path);

  if (asset_path.empty()) {
    PUSH_ERROR_AND_RETURN(
        "TODO: No assetPath but Prim path(e.g. </xform>) in references.");
  }

  // TODO: Use std::stack to manage AssetResolutionResolver state?
  if (current_working_path.size()) {
    resolver.set_current_working_path(current_working_path);
  }

  if (search_paths.size()) {
    resolver.set_search_paths(search_paths);
  }

  // resolve path
  // TODO: Store resolved path to Reference?
  std::string resolved_path = resolver.resolve(asset_path);

  DCOUT("Loading references: " << resolved_path
                               << ", asset_path: " << asset_path);

  if (resolved_path.empty()) {
    if (error_when_asset_not_found) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Failed to resolve asset path `{}`", asset_path));
    } else {
      PUSH_WARN(fmt::format("Asset not found: `{}`", asset_path));
#if 0 // for debugging. print cwd.
#if defined(__linux__)
      char pathname[4096];
      memset(pathname, 0, 4096);
      char *pathname_p = getcwd(pathname, 4096);

      if (pathname_p == nullptr) {
        PUSH_ERROR_AND_RETURN(
            "Getting current working directory failed.");
      }

      PUSH_WARN(fmt::format("  cwd = {}", std::string(pathname_p)));
#endif
#endif
      PUSH_WARN(
          fmt::format("  current working path: `{}`", current_working_path));
      PUSH_WARN(fmt::format("  resolver.current_working_path: `{}`",
                            resolver.current_working_path()));
      PUSH_WARN(fmt::format("  search_paths: `{}`", search_paths));
      PUSH_WARN(fmt::format("  resolver.search_paths: `{}`",
                            resolver.search_paths()));
      (*dst_primspec_root) = nullptr;
      return true;
    }
  }

  resolver.set_search_paths(search_paths);

  // Use resolved asset_path's basedir for current working path.
  // Add resolved asset_path's basedir to search path.
  std::string base_dir = io::GetBaseDir(resolved_path);
  if (base_dir.size()) {
    DCOUT(fmt::format("Add `{}' to asset search path.", base_dir));

    resolver.set_current_working_path(base_dir);

    resolver.add_search_path(base_dir);
  }

  Asset asset;
  if (!resolver.open_asset(resolved_path, asset_path, &asset, warn, err)) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Failed to open asset `{}`.", resolved_path));
  }

  DCOUT("Opened resolved assst: " << resolved_path
                                  << ", asset_path: " << asset_path);

  if (IsBuiltinFileFormat(asset_path)) {
    if (IsUSDFileFormat(asset_path) || IsMtlxFileFormat(asset_path)) {
      // ok
    } else {
      // TODO: obj
      if (error_when_unsupported_fileformat) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "TODO: Unknown/unsupported asset file format: {}", asset_path));
      } else {
        PUSH_WARN(fmt::format(
            "TODO: Unknown/unsupported asset file format. Skipped: {}",
            asset_path));
        return true;
      }
    }
  } else {
    if (fileformats.count(ext)) {
      DCOUT("Fileformat handler found for: " + ext);

    } else {
      DCOUT("Unknown/unsupported fileformat: " + ext);
      if (error_when_unsupported_fileformat) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "Unknown/unsupported asset file format: {}", asset_path));
      } else {
        PUSH_WARN(fmt::format(
            "Unknown/unsupported asset file format. Skipped: {}", asset_path));
        return true;
      }
    }
  }

  Layer layer;
  std::string _warn;
  std::string _err;

  if (IsUSDFileFormat(asset_path)) {
    if (!LoadLayerFromMemory(asset.data(), asset.size(), asset_path, &layer,
                             &_warn, &_err)) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Failed to open `{}` as Layer: {}", asset_path, _err));
    }
  } else if (IsMtlxFileFormat(asset_path)) {
    // primPath must be '</MaterialX>'
    if (primPath.prim_part() != "/MaterialX") {
      PUSH_ERROR_AND_RETURN("Prim path must be </MaterialX>, but got: " +
                            primPath.prim_part());
    }

    PrimSpec ps;
    if (!LoadMaterialXFromAsset(asset, asset_path, ps, &_warn, &_err)) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Failed to open mtlx asset `{}`", asset_path));
    }

    ps.name() = "MaterialX";
    layer.primspecs()["MaterialX"] = ps;

  } else {
    if (fileformats.count(ext)) {
      PrimSpec ps;
      const FileFormatHandler &handler = fileformats.at(ext);

      if (!handler.reader(asset, ps, &_warn, &_err, handler.userdata)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to read asset `{}` error: {}",
                                          asset_path, _err));
      }

      if (ps.name().empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "PrimSpec element_name is empty. asset `{}`", asset_path));
      }

      layer.primspecs()[ps.name()] = ps;
      DCOUT("Read asset from custom fileformat handler: " << ext);
    } else {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "FileFormat handler not found for asset `{}`", asset_path));
    }
  }

  DCOUT("layer = " << print_layer(layer, 0));

  // TODO: Recursively resolve `references`

  if (_warn.size()) {
    if (warn) {
      (*warn) += _warn;
    }
  }

  if (layer.primspecs().empty()) {
    if (error_when_no_prims_found) {
      PUSH_ERROR_AND_RETURN(fmt::format("No prims in layer `{}`", asset_path));
    }

    if (dst_primspec_root) {
      (*dst_primspec_root) = nullptr;
    }

    (*dst_layer) = std::move(layer);

    return true;
  }

  const PrimSpec *src_ps{nullptr};

  if (dst_primspec_root) {
    std::string default_prim;
    if (primPath.is_valid()) {
      default_prim = primPath.prim_part();
      DCOUT("primPath = " << default_prim);
    } else {
      // Use `defaultPrim` metadatum
      if (layer.metas().defaultPrim.valid()) {
        default_prim = "/" + layer.metas().defaultPrim.str();
        DCOUT("layer.meta.defaultPrim = " << default_prim);
      } else {
        // Use the first Prim in the layer.
        default_prim = "/" + layer.primspecs().begin()->first;
        DCOUT("layer.primspecs[0].name = " << default_prim);
      }
    }

    if (!layer.find_primspec_at(Path(default_prim, ""), &src_ps, err)) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "Failed to find PrimSpec `{}` in layer `{}`(resolved path: `{}`)",
          default_prim, asset_path, resolved_path));
    }

    if (!src_ps) {
      PUSH_ERROR_AND_RETURN("Internal error: PrimSpec pointer is nullptr.");
    }

    if (!PropagateAssetResolverState(0, *const_cast<PrimSpec *>(src_ps),
                                     resolver.current_working_path(),
                                     resolver.search_paths())) {
      PUSH_ERROR_AND_RETURN(
          "Store AssetResolver state to each PrimSpec failed.\n");
    }

    (*dst_primspec_root) = src_ps;
  }

  // FIXME: This may be redundant, since assetresulution state is stored in
  // each PrimSpec.
  // TODO: Remove layer-level assetresulution state store?
  //
  // save assetresolution state for nested composition.
  layer.set_asset_resolution_state(resolver.current_working_path(),
                                   resolver.search_paths(),
                                   resolver.get_userdata());

  (*dst_layer) = std::move(layer);

  return true;
}